

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O1

void net_param_save_imp(net_t *n,FILE *fp)

{
  layer *plVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  branch_layer_t *me;
  
  if (0 < n->size) {
    lVar4 = 0;
    do {
      iVar2 = is_branch_layer(n->layer[lVar4]);
      plVar1 = n->layer[lVar4];
      if (iVar2 == 0) {
        data_save(&plVar1->weight,fp);
        data_save(&n->layer[lVar4]->bias,fp);
      }
      else if (0 < *(int *)&plVar1[1].func) {
        lVar5 = 8;
        lVar3 = 0;
        do {
          net_param_save_imp(*(net_t **)((long)plVar1[1].in.val + lVar5),fp);
          lVar3 = lVar3 + 1;
          lVar5 = lVar5 + 0x10;
        } while (lVar3 < *(int *)&plVar1[1].func);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < n->size);
  }
  return;
}

Assistant:

static void net_param_save_imp(net_t *n, FILE *fp)
{
	for (int i = 0; i < n->size; ++i)
	{
		if (!is_branch_layer(n->layer[i]))
		{	
			data_save(&n->layer[i]->weight, fp);
			data_save(&n->layer[i]->bias, fp);
		} else {
			branch_layer_t *me = (branch_layer_t *)n->layer[i];
			for (int j = 0; j < me->num; ++j)
			{
				net_param_save_imp(me->branch[j].n, fp);
			}
		}
	}
}